

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_utility.hpp
# Opt level: O1

string * __thiscall
squall::get_type_text_abi_cxx11_(string *__return_storage_ptr__,squall *this,SQObjectType t)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 0x8000200) {
    if (iVar2 < 0x5000004) {
      if (iVar2 == 0x800) {
        pcVar3 = "userpointer";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
      if (iVar2 == 0x1000001) {
        pcVar3 = "null";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
      if (iVar2 == 0x5000002) {
        pcVar3 = "integer";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
    }
    else if (iVar2 < 0x8000040) {
      if (iVar2 == 0x5000004) {
        pcVar3 = "float";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
      if (iVar2 == 0x8000010) {
        pcVar3 = "string";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
    }
    else {
      if (iVar2 == 0x8000040) {
        pcVar3 = "array";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
      if (iVar2 == 0x8000100) {
        pcVar3 = "closurefunction";
        pcVar1 = "";
        goto LAB_00107ed9;
      }
    }
  }
  else if (iVar2 < 0x8010000) {
    if (iVar2 == 0x8000200) {
      pcVar3 = "native closureC function";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
    if (iVar2 == 0x8000400) {
      pcVar3 = "generator";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
    if (iVar2 == 0x8004000) {
      pcVar3 = "class";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
  }
  else if (iVar2 < 0xa000080) {
    if (iVar2 == 0x8010000) {
      pcVar3 = "weak reference";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
    if (iVar2 == 0xa000020) {
      pcVar3 = "table";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
  }
  else {
    if (iVar2 == 0xa000080) {
      pcVar3 = "userdata";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
    if (iVar2 == 0xa008000) {
      pcVar3 = "instance";
      pcVar1 = "";
      goto LAB_00107ed9;
    }
  }
  pcVar3 = "unknown";
  pcVar1 = "";
LAB_00107ed9:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline
string get_type_text(SQObjectType t) {
    switch(t) {
        case OT_NULL:           return _SC("null");
        case OT_INTEGER:        return _SC("integer");
        case OT_FLOAT:          return _SC("float");
        case OT_STRING:         return _SC("string");
        case OT_TABLE:          return _SC("table");
        case OT_ARRAY:          return _SC("array");
        case OT_USERDATA:       return _SC("userdata");
        case OT_CLOSURE:        return _SC("closurefunction");
        case OT_NATIVECLOSURE:  return _SC("native closureC function");
        case OT_GENERATOR:      return _SC("generator");
        case OT_USERPOINTER:    return _SC("userpointer");
        case OT_CLASS:          return _SC("class");
        case OT_INSTANCE:       return _SC("instance");
        case OT_WEAKREF:        return _SC("weak reference");
        default:                return _SC("unknown");
    }
}